

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

int absl::time_internal::cctz::anon_unknown_0::ToPosixWeekday(weekday wd)

{
  int local_c;
  weekday wd_local;
  
  switch(wd) {
  case monday:
    local_c = 1;
    break;
  case tuesday:
    local_c = 2;
    break;
  case wednesday:
    local_c = 3;
    break;
  case thursday:
    local_c = 4;
    break;
  case friday:
    local_c = 5;
    break;
  case saturday:
    local_c = 6;
    break;
  case sunday:
    local_c = 0;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

inline int ToPosixWeekday(weekday wd) {
  switch (wd) {
    case weekday::sunday:
      return 0;
    case weekday::monday:
      return 1;
    case weekday::tuesday:
      return 2;
    case weekday::wednesday:
      return 3;
    case weekday::thursday:
      return 4;
    case weekday::friday:
      return 5;
    case weekday::saturday:
      return 6;
  }
  return 0; /*NOTREACHED*/
}